

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O1

int mbedtls_ecdsa_genkey
              (mbedtls_ecdsa_context *ctx,mbedtls_ecp_group_id gid,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  
  iVar1 = mbedtls_ecp_group_load(&ctx->grp,gid);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mbedtls_ecp_gen_keypair(&ctx->grp,&ctx->d,&ctx->Q,f_rng,p_rng);
  return iVar1;
}

Assistant:

int mbedtls_ecdsa_genkey(mbedtls_ecdsa_context *ctx, mbedtls_ecp_group_id gid,
                         int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    int ret = 0;
    ret = mbedtls_ecp_group_load(&ctx->grp, gid);
    if (ret != 0) {
        return ret;
    }

    return mbedtls_ecp_gen_keypair(&ctx->grp, &ctx->d,
                                   &ctx->Q, f_rng, p_rng);
}